

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

ImPlotLimits * ImPlot::GetPlotQuery(ImPlotLimits *__return_storage_ptr__,ImPlotYAxis y_axis)

{
  ImPlotPlot *pIVar1;
  bool bVar2;
  double dVar3;
  ImPlotPoint IVar4;
  ImPlotYAxis local_70;
  ImVec2 local_50;
  undefined1 local_48 [8];
  ImPlotPoint p2;
  double local_30;
  ImPlotPoint p1;
  ImPlotPlot *plot;
  ImPlotContext *gp;
  ImPlotYAxis y_axis_local;
  
  bVar2 = false;
  if ((-2 < y_axis) && (bVar2 = false, y_axis < 3)) {
    bVar2 = true;
  }
  if (!bVar2) {
    __assert_fail("(y_axis >= -1 && y_axis < 3) && \"y_axis needs to between -1 and IMPLOT_Y_AXES\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xac1,"ImPlotLimits ImPlot::GetPlotQuery(ImPlotYAxis)");
  }
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    pIVar1 = GImPlot->CurrentPlot;
    local_70 = y_axis;
    if (y_axis < 0) {
      local_70 = GImPlot->CurrentPlot->CurrentYAxis;
    }
    if ((pIVar1->Queried & 1U) == 0) {
      ImPlotLimits::ImPlotLimits(__return_storage_ptr__,0.0,0.0,0.0,0.0);
    }
    else {
      UpdateTransformCache();
      p2.y = (double)::operator+(&(pIVar1->QueryRect).Min,&(pIVar1->PlotRect).Min);
      IVar4 = PixelsToPlot((ImVec2 *)&p2.y,local_70);
      local_50 = ::operator+(&(pIVar1->QueryRect).Max,&(pIVar1->PlotRect).Min);
      _local_48 = PixelsToPlot(&local_50,local_70);
      ImPlotLimits::ImPlotLimits(__return_storage_ptr__);
      local_30 = IVar4.x;
      dVar3 = ImMin<double>(local_30,(double)local_48);
      (__return_storage_ptr__->X).Min = dVar3;
      dVar3 = ImMax<double>(local_30,(double)local_48);
      (__return_storage_ptr__->X).Max = dVar3;
      p1.x = IVar4.y;
      dVar3 = ImMin<double>(p1.x,p2.x);
      (__return_storage_ptr__->Y).Min = dVar3;
      dVar3 = ImMax<double>(p1.x,p2.x);
      (__return_storage_ptr__->Y).Max = dVar3;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"GetPlotQuery() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xac2,"ImPlotLimits ImPlot::GetPlotQuery(ImPlotYAxis)");
}

Assistant:

ImPlotLimits GetPlotQuery(ImPlotYAxis y_axis) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(y_axis >= -1 && y_axis < IMPLOT_Y_AXES, "y_axis needs to between -1 and IMPLOT_Y_AXES");
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "GetPlotQuery() needs to be called between BeginPlot() and EndPlot()!");
    ImPlotPlot& plot = *gp.CurrentPlot;
    y_axis = y_axis >= 0 ? y_axis : gp.CurrentPlot->CurrentYAxis;
    if (!plot.Queried)
        return ImPlotLimits(0,0,0,0);
    UpdateTransformCache();
    ImPlotPoint p1 = PixelsToPlot(plot.QueryRect.Min + plot.PlotRect.Min, y_axis);
    ImPlotPoint p2 = PixelsToPlot(plot.QueryRect.Max + plot.PlotRect.Min, y_axis);
    ImPlotLimits result;
    result.X.Min = ImMin(p1.x, p2.x);
    result.X.Max = ImMax(p1.x, p2.x);
    result.Y.Min = ImMin(p1.y, p2.y);
    result.Y.Max = ImMax(p1.y, p2.y);
    return result;
}